

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O0

void __thiscall ControlParser::parseTimeSetting(ControlParser *this)

{
  byte bVar1;
  int iVar2;
  InputError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [55];
  allocator local_51;
  string local_50 [8];
  string strUnits;
  string local_30 [8];
  string strTime;
  ControlParser *this_local;
  
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::operator>>((istream *)this,local_30);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    std::operator>>((istream *)this,local_50);
  }
  iVar2 = Utilities::getSeconds((string *)local_30,(string *)local_50);
  this->timeSetting = iVar2;
  if (this->timeSetting < 0) {
    this_00 = (InputError *)__cxa_allocate_exception(0x30);
    std::operator+(local_a8,(char *)local_30);
    std::operator+(local_88,local_a8);
    InputError::InputError(this_00,7,local_88);
    __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
  }
  this->controlType = 2;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ControlParser::parseTimeSetting()
{
    // ... read elapsed time and optional time units
    string strTime;
    string strUnits = "";
    sin >> strTime;
    if ( !sin.eof() ) sin >> strUnits;

    // ... convert time string to seconds
    timeSetting = Utilities::getSeconds(strTime, strUnits);
    if ( timeSetting < 0 )
    {
        throw InputError(InputError::INVALID_TIME, strTime + " " + strUnits);
    }
    controlType = Control::ELAPSED_TIME;
}